

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::SeparatedSyntaxList
          (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *this,
          SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *param_1)

{
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *param_1_local;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *this_local;
  
  SyntaxListBase::SyntaxListBase(&this->super_SyntaxListBase,&param_1->super_SyntaxListBase);
  (this->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00910f20;
  (this->elements).data_ = (param_1->elements).data_;
  (this->elements).size_ = (param_1->elements).size_;
  return;
}

Assistant:

class SLANG_EXPORT SeparatedSyntaxList : public SyntaxListBase {
public:
    /// An iterator that will iterate over just the nodes (and skip the delimiters) in the
    /// parent SeparatedSyntaxList.
    template<typename U>
    class iterator_base
        : public iterator_facade<iterator_base<U>, std::random_access_iterator_tag, U, size_t> {
    public:
        using ParentList = std::conditional_t<std::is_const_v<std::remove_pointer_t<U>>,
                                              const SeparatedSyntaxList, SeparatedSyntaxList>;
        iterator_base(ParentList& list, size_t index) : list(&list), index(index) {}
        iterator_base(const iterator_base& other) = default;

        iterator_base& operator=(const iterator_base& other) = default;

        bool operator==(const iterator_base& other) const {
            return list == other.list && index == other.index;
        }

        bool operator<(const iterator_base& other) const { return index < other.index; }

        U operator*() const { return (*list)[index]; }

        size_t operator-(const iterator_base& other) const { return index - other.index; }

        iterator_base& operator+=(ptrdiff_t n) {
            index = size_t(ptrdiff_t(index) + n);
            return *this;
        }
        iterator_base& operator-=(ptrdiff_t n) {
            index = size_t(ptrdiff_t(index) - n);
            return *this;
        }

    private:
        ParentList* list;
        size_t index;
    };

    using iterator = iterator_base<T*>;
    using const_iterator = iterator_base<const T*>;

    SeparatedSyntaxList(nullptr_t) : SeparatedSyntaxList(span<TokenOrSyntax>()) {}
    SeparatedSyntaxList(span<TokenOrSyntax> elements) :
        SyntaxListBase(SyntaxKind::SeparatedList, elements.size()), elements(elements) {}

    /// @return the elements of nodes in the list
    [[nodiscard]] span<const ConstTokenOrSyntax> elems() const {
        return span<const ConstTokenOrSyntax>(elements.data(), elements.size());
    }

    /// @return the elements of nodes in the list
    [[nodiscard]] span<TokenOrSyntax> elems() { return elements; }

    /// @return true if the list is empty, and false if it has elements.
    [[nodiscard]] bool empty() const { return elements.empty(); }

    /// @return the number of nodes in the list (doesn't include delimiter tokens in the count).
    [[nodiscard]] size_t size() const noexcept { return (elements.size() + 1) / 2; }

    const T* operator[](size_t index) const {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }

    T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }

    iterator begin() { return iterator(*this, 0); }
    iterator end() { return iterator(*this, size()); }
    const_iterator begin() const { return cbegin(); }
    const_iterator end() const { return cend(); }
    const_iterator cbegin() const { return const_iterator(*this, 0); }
    const_iterator cend() const { return const_iterator(*this, size()); }

private:
    TokenOrSyntax getChild(size_t index) final { return elements[index]; }